

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
Stack1_base_push_pop_head_Test::~Stack1_base_push_pop_head_Test
          (Stack1_base_push_pop_head_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Stack1_base, push_pop_head) {
	SimpleStack<int> s;
	s.push(1);
	EXPECT_EQ(s.head(), 1);
	s.push(3);
	EXPECT_EQ(s.head(), 3);
	s.pop();
	EXPECT_EQ(s.head(), 1);
}